

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::init
          (PointRenderCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  undefined8 *puVar1;
  int iVar2;
  pointer pVVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  NotSupportedError *pNVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  EVP_PKEY_CTX *ctx_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  GLfloat pointSizeRange [2];
  vector<int,_std::allocator<int>_> cellOrder;
  deRandom local_1b0;
  undefined1 local_1a0 [8];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_128 [264];
  undefined8 uVar16;
  
  if (this->m_isWidePointCase == true) {
    if ((this->super_BBoxRenderCase).m_hasGeometryStage == true) {
      bVar5 = glu::ContextInfo::isExtensionSupported
                        (((this->super_BBoxRenderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_geometry_point_size");
      if (!bVar5) {
        pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1a0 = (undefined1  [8])local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"Test requires GL_EXT_geometry_point_size extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1a0);
        __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    if (((this->super_BBoxRenderCase).m_hasTessellationStage == true) &&
       ((this->super_BBoxRenderCase).m_hasGeometryStage == false)) {
      bVar5 = glu::ContextInfo::isExtensionSupported
                        (((this->super_BBoxRenderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_tessellation_point_size");
      if (!bVar5) {
        pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1a0 = (undefined1  [8])local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"Test requires GL_EXT_tessellation_point_size extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1a0);
        __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    local_1b0.x = 0;
    local_1b0.y = 0;
    iVar6 = (*((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar6) + 0x818))(0x846d,&local_1b0);
    if ((float)local_1b0.y < 5.0) {
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0 = (undefined1  [8])local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Test requires point size 5.0","");
      tcu::NotSupportedError::NotSupportedError(pNVar9,(string *)local_1a0);
      __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_1a0 = (undefined1  [8])
              ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
              ->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Rendering point pattern to ",0x1b);
  bVar5 = (this->super_BBoxRenderCase).m_renderTarget == RENDERTARGET_DEFAULT;
  pcVar13 = "fbo";
  if (bVar5) {
    pcVar13 = "default frame buffer";
  }
  lVar12 = 3;
  if (bVar5) {
    lVar12 = 0x14;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pcVar13,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,
             "Half of the points are green, half blue. Using additive blending.\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,
             "Points are in random order, varying pattern size and location for each iteration.\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,
             "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated red channel."
             ,0x6a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  iVar6 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1a0,(long)(iVar6 * iVar6 * 2),
             (allocator_type *)&local_1b0);
  deRandom_init(&local_1b0,0xde22446);
  auVar18 = _DAT_019f5ce0;
  uVar7 = (uint)((ulong)((long)local_198._M_current - (long)local_1a0) >> 2);
  if (0 < (int)uVar7) {
    lVar12 = (ulong)(uVar7 & 0x7fffffff) - 1;
    auVar14._8_4_ = (int)lVar12;
    auVar14._0_8_ = lVar12;
    auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar10 = 0;
    auVar14 = auVar14 ^ _DAT_019f5ce0;
    auVar15 = _DAT_019fcc00;
    do {
      auVar21 = auVar15 ^ auVar18;
      if ((bool)(~(auVar21._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar21._0_4_ ||
                  auVar14._4_4_ < auVar21._4_4_) & 1)) {
        *(int *)((long)local_1a0 + uVar10 * 4) = (int)uVar10;
      }
      if ((auVar21._12_4_ != auVar14._12_4_ || auVar21._8_4_ <= auVar14._8_4_) &&
          auVar21._12_4_ <= auVar14._12_4_) {
        *(int *)((long)local_1a0 + (uVar10 + 1) * 4) = (int)uVar10 + 1;
      }
      uVar10 = uVar10 + 2;
      lVar12 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar12 + 2;
    } while ((uVar7 + 1 & 0xfffffffe) != uVar10);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_1b0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_1a0,local_198)
  ;
  this_00 = &this->m_attribData;
  ctx_00 = (EVP_PKEY_CTX *)((long)local_198._M_current - (long)local_1a0 >> 1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (this_00,(size_type)ctx_00);
  if (0 < (int)((ulong)((long)local_198._M_current - (long)local_1a0) >> 2)) {
    iVar6 = 1;
    ctx_00 = (EVP_PKEY_CTX *)0x0;
    lVar12 = 0;
    do {
      uVar7 = *(uint *)((long)local_1a0 + lVar12 * 4);
      iVar2 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
      lVar4 = CONCAT44((int)uVar7 >> 0x1f,(int)uVar7 >> 1);
      iVar11 = (int)(lVar4 % (long)iVar2);
      iVar8 = (int)(lVar4 / (long)iVar2);
      if ((uVar7 & 1) == 0) {
        auVar20._0_4_ = (float)iVar2;
        auVar17._0_4_ = (float)iVar8 + 0.5;
        auVar17._4_4_ = (float)iVar11 + 0.5;
        auVar17._8_8_ = 0;
        auVar20._4_4_ = auVar20._0_4_;
        auVar20._8_4_ = auVar20._0_4_;
        auVar20._12_4_ = auVar20._0_4_;
        auVar18 = divps(auVar17,auVar20);
        uVar16 = auVar18._0_8_;
        uVar19 = 0x3f80000000000000;
      }
      else {
        auVar21._0_4_ = (float)iVar2;
        auVar18._0_4_ = (float)iVar11;
        auVar18._4_4_ = (float)iVar8;
        auVar18._8_8_ = 0;
        auVar21._4_4_ = auVar21._0_4_;
        auVar21._8_4_ = auVar21._0_4_;
        auVar21._12_4_ = auVar21._0_4_;
        auVar18 = divps(auVar18,auVar21);
        uVar16 = auVar18._0_8_;
        uVar19 = 0x3f800000;
      }
      puVar1 = (undefined8 *)
               ((long)((this_00->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->m_data + ((long)ctx_00 >> 0x1c))
      ;
      *puVar1 = uVar16;
      puVar1[1] = 0x3f80000000000000;
      pVVar3 = (this_00->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar3[iVar6].m_data[0] = 0.0;
      *(undefined8 *)(pVVar3[iVar6].m_data + 1) = uVar19;
      pVVar3[iVar6].m_data[3] = 1.0;
      lVar12 = lVar12 + 1;
      iVar6 = iVar6 + 2;
      ctx_00 = ctx_00 + 0x200000000;
    } while (lVar12 < (int)((ulong)((long)local_198._M_current - (long)local_1a0) >> 2));
  }
  if (local_1a0 != (undefined1  [8])0x0) {
    ctx_00 = (EVP_PKEY_CTX *)(local_190[0]._M_allocated_capacity - (long)local_1a0);
    operator_delete((void *)local_1a0,(ulong)ctx_00);
  }
  iVar6 = BBoxRenderCase::init(&this->super_BBoxRenderCase,ctx_00);
  return iVar6;
}

Assistant:

void PointRenderCase::init (void)
{
	if (m_isWidePointCase)
	{
		// extensions
		if (m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_point_size"))
			throw tcu::NotSupportedError("Test requires GL_EXT_geometry_point_size extension");
		if (m_hasTessellationStage && !m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_point_size"))
			throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_point_size extension");

		// point size range
		{
			glw::GLfloat pointSizeRange[2] = {0.0f, 0.0f};
			m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, pointSizeRange);

			if (pointSizeRange[1] < 5.0f)
				throw tcu::NotSupportedError("Test requires point size 5.0");
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering point pattern to " << ((m_renderTarget == RENDERTARGET_DEFAULT) ? ("default frame buffer") : ("fbo")) << ".\n"
		<< "Half of the points are green, half blue. Using additive blending.\n"
		<< "Points are in random order, varying pattern size and location for each iteration.\n"
		<< "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated red channel."
		<< tcu::TestLog::EndMessage;

	generateAttributeData();

	BBoxRenderCase::init();
}